

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

THR_MODES get_prediction_mode_idx
                    (PREDICTION_MODE this_mode,MV_REFERENCE_FRAME ref_frame,
                    MV_REFERENCE_FRAME second_ref_frame)

{
  THR_MODES *pTVar1;
  ulong uVar2;
  int iVar3;
  undefined7 in_register_00000039;
  
  if (this_mode < 0xd) {
    uVar2 = (ulong)this_mode;
    pTVar1 = intra_to_mode_idx;
  }
  else {
    iVar3 = (int)CONCAT71(in_register_00000039,this_mode);
    if (this_mode < 0x11) {
      uVar2 = (ulong)ref_frame;
      pTVar1 = single_inter_to_mode_idx[iVar3 - 0xd];
    }
    else {
      if (second_ref_frame == -1 || 0x18 < this_mode) {
        return 0xff;
      }
      uVar2 = (ulong)second_ref_frame;
      pTVar1 = comp_inter_to_mode_idx[iVar3 - 0x11][ref_frame];
    }
  }
  return (*(THR_MODES (*) [8])pTVar1)[uVar2];
}

Assistant:

static inline THR_MODES get_prediction_mode_idx(
    PREDICTION_MODE this_mode, MV_REFERENCE_FRAME ref_frame,
    MV_REFERENCE_FRAME second_ref_frame) {
  if (this_mode < INTRA_MODE_END) {
    assert(ref_frame == INTRA_FRAME);
    assert(second_ref_frame == NONE_FRAME);
    return intra_to_mode_idx[this_mode - INTRA_MODE_START];
  }
  if (this_mode >= SINGLE_INTER_MODE_START &&
      this_mode < SINGLE_INTER_MODE_END) {
    assert((ref_frame > INTRA_FRAME) && (ref_frame <= ALTREF_FRAME));
    return single_inter_to_mode_idx[this_mode - SINGLE_INTER_MODE_START]
                                   [ref_frame];
  }
  if (this_mode >= COMP_INTER_MODE_START && this_mode < COMP_INTER_MODE_END &&
      second_ref_frame != NONE_FRAME) {
    assert((ref_frame > INTRA_FRAME) && (ref_frame <= ALTREF_FRAME));
    assert((second_ref_frame > INTRA_FRAME) &&
           (second_ref_frame <= ALTREF_FRAME));
    return comp_inter_to_mode_idx[this_mode - COMP_INTER_MODE_START][ref_frame]
                                 [second_ref_frame];
  }
  assert(0);
  return THR_INVALID;
}